

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rr_cache.hpp
# Opt level: O1

void __thiscall
cappuccino::
rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_insert(rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
            *this,unsigned_long *key,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  pointer peVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>,_bool>
  pVar2;
  value_type element_idx;
  unsigned_long local_28;
  
  if ((ulong)(((long)(this->m_elements).
                     super__Vector_base<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_elements).
                     super__Vector_base<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) <=
      this->m_open_list_end) {
    do_prune(this);
  }
  local_28 = (this->m_open_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[this->m_open_list_end];
  pVar2 = std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<unsigned_long_const&,unsigned_long&>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->m_keyed_elements,key,&local_28);
  peVar1 = (this->m_elements).
           super__Vector_base<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
           ._M_impl.super__Vector_impl_data._M_start + local_28;
  std::__cxx11::string::operator=((string *)&peVar1->m_value,(string *)value);
  peVar1->m_open_list_position = this->m_open_list_end;
  (peVar1->m_keyed_position).
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (__node_type *)
       pVar2.first.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
       _M_cur;
  this->m_open_list_end = this->m_open_list_end + 1;
  return;
}

Assistant:

auto do_insert(const key_type& key, value_type&& value) -> void
    {
        if (m_open_list_end >= m_elements.size())
        {
            do_prune();
        }

        auto element_idx = m_open_list[m_open_list_end];

        auto keyed_position = m_keyed_elements.emplace(key, element_idx).first;

        element& e             = m_elements[element_idx];
        e.m_value              = std::move(value);
        e.m_open_list_position = m_open_list_end;
        e.m_keyed_position     = keyed_position;

        ++m_open_list_end;
    }